

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O1

void __thiscall
Imf_3_2::TypedDeepImageChannel<unsigned_int>::resize(TypedDeepImageChannel<unsigned_int> *this)

{
  ulong uVar1;
  uint **ppuVar2;
  
  ImageChannel::resize((ImageChannel *)this);
  if (this->_sampleListPointers != (uint **)0x0) {
    operator_delete__(this->_sampleListPointers);
  }
  this->_sampleListPointers = (uint **)0x0;
  uVar1 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  ppuVar2 = (uint **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
  this->_sampleListPointers = ppuVar2;
  (*(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel[8])(this);
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::resize ()
{
    DeepImageChannel::resize ();

    delete[] _sampleListPointers;
    _sampleListPointers = 0;
    _sampleListPointers = new T*[numPixels ()];
    initializeSampleLists ();
}